

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# upnpapi.c
# Opt level: O0

int UpnpAddVirtualDir(char *newDirName,void *cookie,void **oldcookie)

{
  int iVar1;
  size_t sVar2;
  virtualDirList *pvVar3;
  char local_148;
  char acStack_147 [7];
  char dirName [256];
  virtualDirList *local_40;
  virtualDirList *pCurVirtualDir;
  virtualDirList *pLast;
  virtualDirList *pNewVirtualDir;
  void **oldcookie_local;
  void *cookie_local;
  char *newDirName_local;
  
  memset(&local_148,0,0x100);
  if (UpnpSdkInit == 1) {
    if ((newDirName == (char *)0x0) || (sVar2 = strlen(newDirName), sVar2 == 0)) {
      newDirName_local._4_4_ = -0x65;
    }
    else {
      if (*newDirName == '/') {
        sVar2 = strlen(newDirName);
        if (0xff < sVar2) {
          return -0x65;
        }
        strncpy(&local_148,newDirName,0xff);
      }
      else {
        sVar2 = strlen(newDirName);
        if (0xfe < sVar2) {
          return -0x65;
        }
        local_148 = '/';
        strncpy(acStack_147,newDirName,0xfe);
      }
      for (local_40 = pVirtualDirList; local_40 != (virtualDirList *)0x0; local_40 = local_40->next)
      {
        iVar1 = strcmp(local_40->dirName,&local_148);
        if (iVar1 == 0) {
          if (oldcookie != (void **)0x0) {
            *oldcookie = local_40->cookie;
          }
          local_40->cookie = cookie;
          return 0;
        }
      }
      pvVar3 = (virtualDirList *)malloc(0x110);
      if (pvVar3 == (virtualDirList *)0x0) {
        newDirName_local._4_4_ = -0x68;
      }
      else {
        pvVar3->next = (virtual_Dir_List *)0x0;
        if (oldcookie != (void **)0x0) {
          *oldcookie = (void *)0x0;
        }
        pvVar3->cookie = cookie;
        memset(pvVar3->dirName,0,0x100);
        strncpy(pvVar3->dirName,&local_148,0xff);
        sVar2 = strlen(&local_148);
        pvVar3->dirName[sVar2] = '\0';
        if (pVirtualDirList != (virtualDirList *)0x0) {
          for (pCurVirtualDir = pVirtualDirList; pCurVirtualDir->next != (virtual_Dir_List *)0x0;
              pCurVirtualDir = pCurVirtualDir->next) {
          }
          pCurVirtualDir->next = pvVar3;
          pvVar3 = pVirtualDirList;
        }
        pVirtualDirList = pvVar3;
        newDirName_local._4_4_ = 0;
      }
    }
  }
  else {
    newDirName_local._4_4_ = -0x74;
  }
  return newDirName_local._4_4_;
}

Assistant:

int UpnpAddVirtualDir(
	const char *newDirName, const void *cookie, const void **oldcookie)
{
	virtualDirList *pNewVirtualDir;
	virtualDirList *pLast;
	virtualDirList *pCurVirtualDir;
	char dirName[NAME_SIZE];

	memset(dirName, 0, sizeof(dirName));
	if (UpnpSdkInit != 1) {
		/* SDK is not initialized */
		return UPNP_E_FINISH;
	}

	if ((newDirName == NULL) || (strlen(newDirName) == (size_t)0)) {
		return UPNP_E_INVALID_PARAM;
	}

	if (*newDirName != '/') {
		if (strlen(newDirName) > sizeof(dirName) - 2)
			return UPNP_E_INVALID_PARAM;
		dirName[0] = '/';
		strncpy(dirName + 1, newDirName, sizeof(dirName) - 2);
	} else {
		if (strlen(newDirName) > sizeof(dirName) - 1)
			return UPNP_E_INVALID_PARAM;
		strncpy(dirName, newDirName, sizeof(dirName) - 1);
	}

	pCurVirtualDir = pVirtualDirList;
	while (pCurVirtualDir != NULL) {
		/* already has this entry */
		if (strcmp(pCurVirtualDir->dirName, dirName) == 0) {
			if (oldcookie != NULL)
				*oldcookie = pCurVirtualDir->cookie;
			pCurVirtualDir->cookie = cookie;
			return UPNP_E_SUCCESS;
		}

		pCurVirtualDir = pCurVirtualDir->next;
	}

	pNewVirtualDir = (virtualDirList *)malloc(sizeof(virtualDirList));
	if (pNewVirtualDir == NULL) {
		return UPNP_E_OUTOF_MEMORY;
	}
	pNewVirtualDir->next = NULL;
	if (oldcookie != NULL)
		*oldcookie = NULL;
	pNewVirtualDir->cookie = cookie;
	memset(pNewVirtualDir->dirName, 0, sizeof(pNewVirtualDir->dirName));
	strncpy(pNewVirtualDir->dirName,
		dirName,
		sizeof(pNewVirtualDir->dirName) - 1);
	*(pNewVirtualDir->dirName + strlen(dirName)) = 0;

	if (pVirtualDirList == NULL) { /* first virtual dir */
		pVirtualDirList = pNewVirtualDir;
	} else {
		pLast = pVirtualDirList;
		while (pLast->next != NULL) {
			pLast = pLast->next;
		}
		pLast->next = pNewVirtualDir;
	}

	return UPNP_E_SUCCESS;
}